

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  undefined1 uVar4;
  long lVar5;
  byte bVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  int tok;
  int local_44;
  char **local_40;
  ENCODING *local_38;
  
  lVar8 = (long)end - (long)ptr;
  if (lVar8 < 2) {
    return -1;
  }
  bVar2 = *ptr;
  if (bVar2 < 0xdc) {
    bVar6 = 7;
    if (bVar2 - 0xd8 < 4) goto LAB_0046967e;
    if (bVar2 == 0) {
      bVar6 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      goto LAB_0046967e;
    }
  }
  else {
    if (bVar2 - 0xdc < 4) {
      bVar6 = 8;
      goto LAB_0046967e;
    }
    if ((bVar2 == 0xff) && (0xfd < (byte)ptr[1])) {
      bVar6 = 0;
      goto LAB_0046967e;
    }
  }
  bVar6 = 0x1d;
LAB_0046967e:
  if (bVar6 < 0x16) {
    if (bVar6 != 5) {
      if (bVar6 == 6) {
        if (lVar8 == 2) {
          return -2;
        }
      }
      else if ((bVar6 == 7) && (lVar8 < 4)) {
        return -2;
      }
    }
  }
  else if (((bVar6 == 0x16) || (bVar6 == 0x18)) ||
          ((bVar6 == 0x1d &&
           ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[1] >> 3 & 0x1c |
                             (uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] << 5)) >> ((byte)ptr[1] & 0x1f)
            & 1) != 0)))) {
    if (lVar8 + -2 < 2) {
      return -1;
    }
    lVar9 = 5;
    lVar5 = 0;
LAB_00469725:
    bVar2 = ptr[lVar9 + -3];
    if (bVar2 < 0xdc) {
      uVar4 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          uVar4 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[lVar9 + -2]);
        }
        else {
LAB_0046977e:
          uVar4 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      uVar4 = 8;
    }
    else {
      if ((bVar2 != 0xff) || ((byte)ptr[lVar9 + -2] < 0xfe)) goto LAB_0046977e;
      uVar4 = 0;
    }
    local_40 = nextTokPtr;
    switch(uVar4) {
    case 5:
      break;
    case 6:
      if (lVar8 + lVar5 == 4) {
        return -2;
      }
      break;
    case 7:
      if (lVar8 + lVar5 + -2 < 4) {
        return -2;
      }
      break;
    default:
      pcVar7 = ptr + (2 - lVar5);
      goto LAB_00469925;
    case 9:
    case 10:
    case 0x15:
      local_38 = enc;
      iVar3 = big2_checkPiTarget((ENCODING *)ptr,ptr + (2 - lVar5),(char *)&local_44,
                                 (int *)nextTokPtr);
      if (iVar3 == 0) {
        *local_40 = ptr + (2 - lVar5);
        return 0;
      }
      lVar8 = lVar8 + lVar5 + -4;
      if (lVar8 < 2) {
        return -1;
      }
      pbVar10 = (byte *)(ptr + (4 - lVar5));
      goto LAB_00469851;
    case 0xf:
      local_38 = (ENCODING *)(ptr + (2 - lVar5));
      iVar3 = big2_checkPiTarget((ENCODING *)ptr,(char *)local_38,(char *)&local_44,
                                 (int *)nextTokPtr);
      if (iVar3 == 0) {
        *local_40 = (char *)local_38;
        return 0;
      }
      if (lVar8 + lVar5 + -4 < 2) {
        return -1;
      }
      pcVar7 = ptr + (4 - lVar5);
      nextTokPtr = local_40;
      if ((ptr[lVar9 + -1] == '\0') && (ptr[lVar9] == '>')) {
        *local_40 = ptr + (6 - lVar5);
        return local_44;
      }
LAB_00469925:
      *nextTokPtr = pcVar7;
      return 0;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_0046979a_caseD_16;
    case 0x1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)((byte)ptr[lVar9 + -2] >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5)) >>
           ((byte)ptr[lVar9 + -2] & 0x1f) & 1) != 0) goto switchD_0046979a_caseD_16;
    }
    ptr = ptr + (2 - lVar5);
  }
  *nextTokPtr = ptr;
  return 0;
switchD_0046979a_caseD_16:
  lVar1 = lVar8 + lVar5;
  lVar5 = lVar5 + -2;
  lVar9 = lVar9 + 2;
  if (lVar1 + -4 < 2) {
    return -1;
  }
  goto LAB_00469725;
LAB_00469851:
  bVar2 = *pbVar10;
  if (bVar2 < 0xdc) {
    uVar4 = 7;
    if (3 < bVar2 - 0xd8) {
      if (bVar2 == 0) {
        uVar4 = *(undefined1 *)((long)local_38[1].scanners + (ulong)pbVar10[1]);
      }
      else {
LAB_0046989f:
        uVar4 = 0x1d;
      }
    }
  }
  else if (bVar2 - 0xdc < 4) {
    uVar4 = 8;
  }
  else {
    if ((bVar2 != 0xff) || (pbVar10[1] < 0xfe)) goto LAB_0046989f;
    uVar4 = 0;
  }
  switch(uVar4) {
  case 0:
  case 1:
  case 8:
    *local_40 = (char *)pbVar10;
    return 0;
  default:
    pbVar11 = pbVar10 + 2;
    break;
  case 6:
    if (lVar8 == 2) {
      return -2;
    }
    pbVar11 = pbVar10 + 3;
    break;
  case 7:
    if (lVar8 < 4) {
      return -2;
    }
    pbVar11 = pbVar10 + 4;
    break;
  case 0xf:
    pbVar11 = pbVar10 + 2;
    if ((long)end - (long)pbVar11 < 2) {
      return -1;
    }
    if ((*pbVar11 == 0) && (pbVar10[3] == 0x3e)) {
      *local_40 = (char *)(pbVar10 + 4);
      return local_44;
    }
  }
  lVar8 = (long)end - (long)pbVar11;
  pbVar10 = pbVar11;
  if (lVar8 < 2) {
    return -1;
  }
  goto LAB_00469851;
}

Assistant:

static int PTRCALL
PREFIX(scanPi)(const ENCODING *enc, const char *ptr,
               const char *end, const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (HAS_CHAR(enc, ptr, end)) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}